

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O0

atomic<long> * __thiscall
ylt::metric::thread_local_value<long>::get_value(thread_local_value<long> *this,size_t index)

{
  bool bVar1;
  __pointer_type paVar2;
  atomic<long> *this_00;
  size_type in_RSI;
  vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  *in_RDI;
  atomic<long> *expected;
  atomic<long> *ptr;
  memory_order in_stack_000000fc;
  __pointer_type in_stack_00000100;
  __pointer_type *in_stack_00000108;
  atomic<std::atomic<long>_*> *in_stack_00000110;
  __integral_type in_stack_ffffffffffffffc8;
  
  std::vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  ::operator[](in_RDI,in_RSI);
  paVar2 = std::atomic::operator_cast_to_atomic_((atomic<std::atomic<long>_*> *)0x1ad26a);
  if (paVar2 == (__pointer_type)0x0) {
    this_00 = (atomic<long> *)operator_new(8);
    std::atomic<long>::atomic(this_00,in_stack_ffffffffffffffc8);
    std::
    vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>::
    operator[](in_RDI,in_RSI);
    bVar1 = std::atomic<std::atomic<long>_*>::compare_exchange_strong
                      (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000fc);
    if ((!bVar1) && (this_00 != (atomic<long> *)0x0)) {
      operator_delete(this_00,8);
    }
  }
  std::vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  ::operator[](in_RDI,in_RSI);
  paVar2 = std::atomic::operator_cast_to_atomic_((atomic<std::atomic<long>_*> *)0x1ad300);
  return paVar2;
}

Assistant:

auto &get_value(size_t index) {
    if (duplicates_[index] == nullptr) {
      auto ptr = new std::atomic<value_type>(0);

      std::atomic<value_type> *expected = nullptr;
      if (!duplicates_[index].compare_exchange_strong(expected, ptr)) {
        delete ptr;
      }
    }
    return *duplicates_[index];
  }